

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

bool __thiscall
QPDFObjectHandle::isDictionaryOfType(QPDFObjectHandle *this,string *type,string *subtype)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  bool local_ba;
  bool local_a5;
  allocator<char> local_a1;
  string local_a0 [32];
  QPDFObjectHandle local_80;
  byte local_6e;
  byte local_6d;
  byte local_5a;
  allocator<char> local_59;
  string local_58 [32];
  QPDFObjectHandle local_38;
  string *local_28;
  string *subtype_local;
  string *type_local;
  QPDFObjectHandle *this_local;
  
  local_28 = subtype;
  subtype_local = type;
  type_local = (string *)this;
  bVar1 = isDictionary(this);
  local_5a = 0;
  local_6d = 0;
  local_6e = 0;
  bVar4 = false;
  local_a5 = false;
  if (bVar1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::allocator<char>::allocator();
      local_5a = 1;
      std::__cxx11::string::string<std::allocator<char>>(local_58,"/Type",&local_59);
      local_6d = 1;
      getKey(&local_38,(string *)this);
      local_6e = 1;
      bVar1 = isNameAndEquals(&local_38,subtype_local);
      local_a5 = false;
      if (!bVar1) goto LAB_002c19d9;
    }
    bVar2 = std::__cxx11::string::empty();
    bVar4 = (bVar2 & 1) == 0;
    local_ba = true;
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Subtype",&local_a1);
      getKey(&local_80,(string *)this);
      local_ba = isNameAndEquals(&local_80,local_28);
    }
    local_a5 = local_ba;
  }
LAB_002c19d9:
  this_local._7_1_ = local_a5;
  if (bVar4) {
    ~QPDFObjectHandle(&local_80);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  if ((local_6e & 1) != 0) {
    ~QPDFObjectHandle(&local_38);
  }
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string(local_58);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator(&local_59);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
QPDFObjectHandle::isDictionaryOfType(std::string const& type, std::string const& subtype) const
{
    return isDictionary() && (type.empty() || getKey("/Type").isNameAndEquals(type)) &&
        (subtype.empty() || getKey("/Subtype").isNameAndEquals(subtype));
}